

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_sqrt_mips64(floatx80 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  ushort uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint32_t bLow;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint32_t aLow;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  floatx80 fVar26;
  floatx80 fVar27;
  
  uVar14 = a._8_8_;
  uVar16 = a.low;
  uVar4 = a.high;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar16
     ) {
LAB_0086e432:
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips64(float_status *)");
    }
    uVar16 = 0xc000000000000000;
    uVar14 = CONCAT62((int6)(uVar14 >> 0x10),0xffff);
    goto LAB_0086e83f;
  }
  uVar19 = (uint)(uVar4 & 0x7fff);
  if ((uVar4 & 0x7fff) == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      uVar14 = CONCAT62(a._10_6_,0x7fff);
      if (-1 < (short)uVar4) goto LAB_0086e83f;
      goto LAB_0086e432;
    }
    auVar3 = a._0_12_;
    fVar26._12_4_ = 0;
    fVar26.low = auVar3._0_8_;
    fVar26.high = auVar3._8_2_;
    fVar26._10_2_ = auVar3._10_2_;
    fVar26 = propagateFloatx80NaN_mips64(a,fVar26,status);
    auVar3 = fVar26._0_12_;
  }
  else {
    if ((short)uVar4 < 0) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar16 == 0)
      goto LAB_0086e83f;
      goto LAB_0086e432;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
      if (uVar16 == 0) {
        uVar16 = 0;
        uVar14 = 0;
        goto LAB_0086e83f;
      }
      uVar14 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar16 = uVar16 << ((byte)(uVar14 ^ 0x3f) & 0x3f);
      uVar19 = 1 - (int)(uVar14 ^ 0x3f);
    }
    uVar14 = uVar16 >> 0x20;
    uVar13 = (uint)(uVar16 >> 0x20);
    if ((uVar19 & 1) == 0) {
      uVar18 = (uVar13 >> 0x11 | 0x8000) -
               (uint)*(ushort *)
                      (estimateSqrt32_sqrtEvenAdjustments + (ulong)(uVar13 >> 0x1b & 0xf) * 2);
      uVar18 = (int)(uVar14 / uVar18) + uVar18;
      uVar20 = 0xffff8000;
      if (uVar18 < 0x20000) {
        uVar20 = uVar18 * 0x8000;
      }
      if (uVar13 < uVar20) goto LAB_0086e564;
      uVar13 = (int)uVar13 >> 1;
    }
    else {
      uVar20 = ((uVar13 >> 0x11) -
               (uint)*(ushort *)
                      (estimateSqrt32_sqrtOddAdjustments + (ulong)(uVar13 >> 0x1b & 0xf) * 2)) +
               0x4000;
      uVar20 = uVar20 * 0x8000 + (int)(uVar14 / uVar20) * 0x4000;
      uVar14 = (ulong)(uVar13 >> 1);
LAB_0086e564:
      uVar13 = (uVar20 >> 1) + (int)((uVar14 << 0x1f) / (ulong)uVar20);
    }
    uVar7 = CONCAT44(0,uVar13);
    bVar8 = (byte)(uVar19 & 1) | 2;
    uVar15 = uVar16 >> bVar8;
    uVar16 = uVar16 << (-bVar8 & 0x3f);
    uVar14 = 0xffffffffffffffff;
    if (uVar15 < uVar7 << 0x20) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar15;
      uVar11 = SUB168(auVar2 / auVar1,0) << 0x20;
      for (lVar5 = uVar15 - SUB164(auVar2 / auVar1,0) * uVar7; lVar5 < 0; lVar5 = lVar5 + uVar7) {
        uVar11 = uVar11 - 0x100000000;
      }
      uVar14 = lVar5 << 0x20 | uVar16 >> 0x20;
      if (uVar14 < uVar7 << 0x20) {
        uVar14 = uVar14 / uVar7;
      }
      else {
        uVar14 = 0xffffffff;
      }
      uVar14 = uVar14 | uVar11;
    }
    uVar9 = uVar14 + uVar7 * 0x40000000;
    uVar11 = uVar9 * 2;
    uVar12 = uVar9 >> 0x20;
    uVar22 = (uVar9 & 0xffffffff) * uVar12;
    uVar23 = uVar22 >> 0x1f;
    uVar9 = uVar9 * uVar9;
    uVar17 = uVar16 - uVar9;
    lVar5 = ((uVar15 - (uVar16 < uVar9)) -
            ((uVar23 & 0xffffffff) + uVar12 * uVar12 + (uVar23 & 0x100000000))) -
            (ulong)(uVar9 < uVar22 << 0x21);
    if (lVar5 < 0) {
      lVar6 = uVar14 + uVar7 * 0x40000000;
      uVar16 = uVar11;
      do {
        lVar6 = lVar6 + -1;
        uVar11 = uVar16 - 2;
        bVar24 = CARRY8(uVar17,uVar16 - 1);
        uVar17 = uVar17 + (uVar16 - 1);
        lVar5 = (lVar5 - (lVar6 >> 0x3f)) + (ulong)bVar24;
        uVar16 = uVar11;
      } while (lVar5 < 0);
    }
    uVar16 = 0xffffffffffffffff;
    if (uVar17 < uVar11) {
      uVar14 = uVar11 >> 0x20;
      uVar15 = 0xffffffff00000000;
      if (uVar17 < (uVar11 & 0xffffffff00000000)) {
        uVar15 = uVar17 / uVar14 << 0x20;
      }
      uVar9 = (uVar15 >> 0x20) * (uVar11 & 0xffffffff);
      uVar7 = uVar15 * uVar11;
      uVar16 = -uVar7;
      lVar5 = ((uVar17 - ((uVar9 >> 0x20) + (uVar15 >> 0x20) * uVar14)) - (ulong)(uVar7 != 0)) -
              (ulong)(uVar7 < uVar9 << 0x20);
      if (lVar5 < 0) {
        uVar7 = (0x100000000 - uVar15) * uVar11;
        uVar9 = uVar16;
        do {
          uVar15 = uVar15 - 0x100000000;
          uVar16 = uVar9 + (uVar11 << 0x20);
          bVar24 = uVar7 < uVar9;
          uVar7 = uVar7 + (uVar11 << 0x20);
          lVar5 = lVar5 + uVar14 + (ulong)bVar24;
          uVar9 = uVar16;
        } while (lVar5 < 0);
      }
      uVar16 = uVar16 >> 0x20 | lVar5 << 0x20;
      if (uVar16 < (uVar11 & 0xffffffff00000000)) {
        uVar16 = uVar16 / uVar14;
      }
      else {
        uVar16 = 0xffffffff;
      }
      uVar16 = uVar16 | uVar15;
      if ((uVar16 & 0x3ffffffffffffffe) < 6) {
        uVar16 = uVar16 + (uVar16 == 0);
        uVar15 = uVar16 >> 0x20;
        uVar12 = (uVar11 & 0xffffffff) * uVar15;
        uVar7 = (uVar16 & 0xffffffff) * uVar14;
        lVar5 = 0;
        uVar9 = uVar7 + uVar12;
        if (CARRY8(uVar7,uVar12)) {
          lVar5 = -0x100000000;
        }
        uVar7 = uVar16 * uVar11;
        uVar12 = (uVar16 & 0xffffffff) * uVar15;
        uVar22 = uVar12 >> 0x1f;
        uVar23 = uVar16 * uVar16;
        uVar21 = (uVar22 & 0xffffffff) + uVar15 * uVar15 + (uVar22 & 0x100000000) +
                 (ulong)(uVar23 < uVar12 << 0x21);
        uVar12 = -uVar7 - uVar21;
        uVar10 = -uVar23;
        uVar22 = uVar12 - (uVar23 != 0);
        lVar5 = (((((uVar17 - (uVar7 != 0)) - ((uVar9 >> 0x20) + uVar14 * uVar15)) + lVar5) -
                 (ulong)(uVar7 < uVar9 << 0x20)) - (ulong)(-uVar7 < uVar21)) -
                (ulong)(uVar12 < (uVar23 != 0));
        if (lVar5 < 0) {
          uVar14 = uVar16 * 2 - 1;
          do {
            uVar16 = uVar16 - 1;
            uVar15 = uVar16 >> 0x3f | uVar11;
            bVar24 = CARRY8(uVar10,uVar14);
            uVar10 = uVar10 + uVar14;
            bVar25 = CARRY8(uVar22,uVar15);
            uVar15 = uVar22 + uVar15;
            uVar22 = uVar15 + bVar24;
            lVar5 = lVar5 + (ulong)(bVar25 || CARRY8(uVar15,(ulong)bVar24));
            uVar14 = uVar14 - 2;
          } while (lVar5 < 0);
        }
        uVar16 = uVar16 | ((lVar5 != 0 || uVar22 != 0) || uVar10 != 0);
      }
    }
    fVar26 = roundAndPackFloatx80_mips64
                       (status->floatx80_rounding_precision,'\0',
                        ((int)(uVar19 - 0x3fff) >> 1) + 0x3fff,uVar16 >> 0x3f | uVar11,uVar16 * 2,
                        status);
    auVar3 = fVar26._0_12_;
  }
  uVar16 = auVar3._0_8_;
  uVar14 = (ulong)auVar3._8_4_;
LAB_0086e83f:
  fVar27._8_8_ = uVar14 & 0xffffffff;
  fVar27.low = uVar16;
  return fVar27;
}

Assistant:

floatx80 floatx80_sqrt(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig0 << 1)) {
            return propagateFloatx80NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( aSig0 == 0 ) return packFloatx80( 0, 0, 0 );
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFF;
    zSig0 = estimateSqrt32( aExp, aSig0>>32 );
    shift128Right( aSig0, 0, 2 + ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & UINT64_C(0x3FFFFFFFFFFFFFFF) ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shortShift128Left( 0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= doubleZSig0;
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                0, zExp, zSig0, zSig1, status);
}